

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O2

void __thiscall
TPZFrontNonSym<double>::TensorProductIJ
          (TPZFrontNonSym<double> *this,int ithread,STensorProductMTData *data)

{
  double dVar1;
  TPZVec<double> *pTVar2;
  double *pdVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  double *pdVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  if (data == (STensorProductMTData *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/TPZFrontNonSym.cpp"
               ,0x11a);
  }
  lVar11 = (long)ithread;
  while( true ) {
    if (data->fRunning != true) {
      return;
    }
    TPZSemaphore::Wait((data->fWorkSem).fStore + lVar11);
    if (data->fRunning != true) break;
    pTVar2 = data->fAuxVecCol;
    lVar4 = (long)(this->super_TPZFront<double>).fMaxFront;
    iVar8 = (int)pTVar2->fNElements;
    iVar5 = 0;
    if (0 < iVar8) {
      iVar5 = iVar8;
    }
    lVar6 = (long)(int)((ulong)((long)(data->fThreads).
                                      super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)(data->fThreads).
                                     super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                     _M_impl.super__Vector_impl_data._M_start) >> 3);
    pdVar7 = (double *)(lVar11 * 8 * lVar4 + (long)(this->super_TPZFront<double>).fData.fStore);
    for (lVar9 = lVar11; lVar9 < iVar8; lVar9 = lVar9 + lVar6) {
      dVar1 = data->fAuxVecRow->fStore[lVar9];
      pdVar3 = pTVar2->fStore;
      for (lVar10 = 0; iVar5 != (int)lVar10; lVar10 = lVar10 + 1) {
        pdVar7[lVar10] = pdVar7[lVar10] - pdVar3[lVar10] * dVar1;
      }
      pdVar7 = pdVar7 + lVar4 * lVar6;
    }
    TPZFront<double>::STensorProductMTData::WorkDone(data);
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::TensorProductIJ(int ithread,typename TPZFront<TVar>::STensorProductMTData *data){
  if(!data) DebugStop();
  while(data->fRunning){
    data->fWorkSem[ithread].Wait();
    if(!data->fRunning) break;
    const int n = data->fAuxVecCol->NElements();
    const int Nthreads = data->NThreads();
		
    for(int j = 0 + ithread; j < n; j += Nthreads){
      const TVar RowVal = data->fAuxVecRow->operator[](j);
      int i = 0;
      TVar * ElemPtr = &(this->Element(i,j));
      TVar * ColValPtr = &(data->fAuxVecCol->operator[](i));
      for(; i < n; i++, ColValPtr++, ElemPtr++){
        (*ElemPtr) -=  (*ColValPtr) * RowVal;
      }///i
    }///j
    data->WorkDone();
  }///while
}